

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

int32_t __thiscall fasttext::Dictionary::find(Dictionary *this,string *w,uint32_t h)

{
  pointer piVar1;
  pointer peVar2;
  pointer __s2;
  size_t sVar3;
  size_t __n;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  piVar1 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (ulong)((long)(this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar1) >> 2;
  uVar6 = (ulong)h % (uVar7 & 0xffffffff);
  iVar5 = (int)uVar6;
  iVar4 = piVar1[iVar5];
  if (iVar4 != -1) {
    peVar2 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    __s2 = (w->_M_dataplus)._M_p;
    sVar3 = w->_M_string_length;
    do {
      iVar5 = (int)uVar6;
      __n = peVar2[iVar4].word._M_string_length;
      if (__n == sVar3) {
        if (__n == 0) {
          return iVar5;
        }
        iVar4 = bcmp(peVar2[iVar4].word._M_dataplus._M_p,__s2,__n);
        if (iVar4 == 0) {
          return iVar5;
        }
      }
      uVar6 = (long)(iVar5 + 1) % (long)(int)uVar7;
      iVar5 = (int)uVar6;
      uVar6 = uVar6 & 0xffffffff;
      iVar4 = piVar1[iVar5];
    } while (iVar4 != -1);
  }
  return iVar5;
}

Assistant:

int32_t Dictionary::find(const std::string& w, uint32_t h) const {
	int32_t word2intsize = word2int_.size();
	int32_t id = h % word2intsize;
	while (word2int_[id] != -1 && words_[word2int_[id]].word != w) {
		id = (id + 1) % word2intsize;
	}
	return id;
}